

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O3

TargetList *
Analyser::Static::DiskII::GetTargets
          (TargetList *__return_storage_ptr__,Media *media,string *param_2,IntType param_3)

{
  uint uVar1;
  pointer psVar2;
  Target *pTVar3;
  element_type *peVar4;
  int iVar5;
  Time this;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  Target *this_00;
  bool bVar8;
  initializer_list<unsigned_short> __l;
  shared_ptr<Storage::Disk::Track> track_zero;
  map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
  sector_map;
  Disassembly disassembly;
  allocator_type local_289;
  _Any_data local_288;
  code *local_278;
  code *pcStack_270;
  unsigned_short local_25a;
  undefined8 local_258;
  undefined8 uStack_250;
  code *local_248;
  code *pcStack_240;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_238;
  Track *local_220;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>,_std::_Select1st<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
  local_210;
  undefined1 local_1e0 [8];
  _Rb_tree_node_base local_1d8;
  _Bit_pointer local_1b8;
  _Bit_type *local_1b0;
  _Rb_tree_node_base local_1a8;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_180;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_150;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_120;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_f0;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_c0;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_90;
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  local_60;
  
  psVar2 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar2 == (media->disks).
                super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar5 = (*((psVar2->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Disk[2])();
  if (0xa0 < iVar5) {
    this = (Time)operator_new(0x90);
    AppleIIgs::Target::Target((Target *)this);
    local_1e0 = (undefined1  [8])this;
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_1e0);
    if ((Time)local_1e0 != (Time)0x0) {
      (**(code **)(*(long *)local_1e0 + 8))();
    }
    pTVar3 = (__return_storage_ptr__->
             super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
             ._M_t.
             super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
             .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl;
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ::operator=(&(pTVar3->media).disks,&media->disks);
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ::operator=(&(pTVar3->media).tapes,&media->tapes);
    std::
    vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ::operator=(&(pTVar3->media).cartridges,&media->cartridges);
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ::operator=(&(pTVar3->media).mass_storage_devices,&media->mass_storage_devices);
    return __return_storage_ptr__;
  }
  peVar4 = (psVar2->super___shared_ptr<Storage::Disk::Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar4->_vptr_Disk[4])(&local_220,peVar4,0);
  Storage::Disk::track_serialisation((PCMSegment *)local_1e0,local_220,(Time)0xc35000000001);
  Storage::Encodings::AppleGCR::sectors_from_segment
            ((map<unsigned_long,_Storage::Encodings::AppleGCR::Sector,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
              *)&local_210,(PCMSegment *)local_1e0);
  if (local_1b0 != (_Bit_type *)0x0) {
    operator_delete(local_1b0,(long)local_1a8._M_right - (long)local_1b0);
    local_1b0 = (_Bit_type *)0x0;
    local_1a8._M_color = _S_red;
    local_1a8._M_parent = (_Base_ptr)0x0;
    local_1a8._M_left._0_4_ = 0;
    local_1a8._M_right = (_Base_ptr)0x0;
  }
  if ((_Bit_type *)local_1d8._0_8_ != (_Bit_type *)0x0) {
    operator_delete((void *)local_1d8._0_8_,(long)local_1b8 - local_1d8._0_8_);
  }
  for (p_Var6 = local_210._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_210._M_impl.super__Rb_tree_header;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    if (*(char *)((long)&p_Var6[1]._M_parent + 2) == '\0') {
      uStack_250 = 0;
      local_258 = 0xb800;
      pcStack_240 = std::
                    _Function_handler<unsigned_long_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Analyser/Static/DiskII/../Disassembler/AddressMapper.hpp:20:9)>
                    ::_M_invoke;
      local_248 = std::
                  _Function_handler<unsigned_long_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Analyser/Static/DiskII/../Disassembler/AddressMapper.hpp:20:9)>
                  ::_M_manager;
      local_288._M_unused._M_object = (void *)0x0;
      local_288._8_8_ = 0;
      local_278 = (code *)0x0;
      pcStack_270 = (code *)0x0;
      local_288._M_unused._M_object = operator_new(0x20);
      *(code **)((long)local_288._M_unused._0_8_ + 0x18) =
           std::
           _Function_handler<unsigned_long_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Analyser/Static/DiskII/../Disassembler/AddressMapper.hpp:20:9)>
           ::_M_invoke;
      *(undefined8 *)local_288._M_unused._0_8_ = local_258;
      *(undefined8 *)((long)local_288._M_unused._0_8_ + 8) = uStack_250;
      *(code **)((long)local_288._M_unused._0_8_ + 0x10) =
           std::
           _Function_handler<unsigned_long_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Analyser/Static/DiskII/../Disassembler/AddressMapper.hpp:20:9)>
           ::_M_manager;
      local_248 = (code *)0x0;
      pcStack_240 = (code *)0x0;
      pcStack_270 = std::
                    _Function_handler<unsigned_long_(unsigned_short),_std::function<unsigned_long_(int)>_>
                    ::_M_invoke;
      local_278 = std::
                  _Function_handler<unsigned_long_(unsigned_short),_std::function<unsigned_long_(int)>_>
                  ::_M_manager;
      local_25a = 0xb800;
      __l._M_len = 1;
      __l._M_array = &local_25a;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&local_238,__l,&local_289);
      MOS6502::Disassemble
                ((Disassembly *)local_1e0,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var6[1]._M_left,
                 (function<unsigned_long_(unsigned_short)> *)&local_288,&local_238);
      if (local_238.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_278 != (code *)0x0) {
        (*local_278)(&local_288,&local_288,__destroy_functor);
      }
      if (local_248 != (code *)0x0) {
        (*local_248)(&local_258,&local_258,3);
      }
      if (local_1d8._M_left == &local_1d8) goto LAB_0016401a;
      bVar8 = false;
      goto LAB_00163fc2;
    }
  }
  if (local_210._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_1e0 = (undefined1  [8])anon_unknown.dwarf_28155a::AppleIITarget((Sector *)0x0);
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)local_1e0);
    if ((Time)local_1e0 != (Time)0x0) {
      (**(code **)(*(long *)local_1e0 + 8))();
    }
    pTVar3 = (__return_storage_ptr__->
             super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
             ._M_t.
             super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
             .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl;
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
    ::operator=(&(pTVar3->media).disks,&media->disks);
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
    ::operator=(&(pTVar3->media).tapes,&media->tapes);
    std::
    vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
    ::operator=(&(pTVar3->media).cartridges,&media->cartridges);
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
    ::operator=(&(pTVar3->media).mass_storage_devices,&media->mass_storage_devices);
  }
  goto LAB_00164199;
LAB_00163fc2:
  do {
    uVar1 = *(uint *)&local_1d8._M_left[1]._M_parent;
    if (((ulong)uVar1 < 0x2a) && ((0x2a000000000U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      bVar8 = *(short *)&local_1d8._M_left[1].field_0x4 == 0x31c &&
              *(int *)((long)&local_1d8._M_left[1]._M_parent + 4) == 0;
    }
    else if (bVar8) {
      bVar8 = false;
      if ((uVar1 == 0x2b) && (*(short *)&local_1d8._M_left[1].field_0x4 == 0xfb)) {
        bVar8 = true;
        goto LAB_0016401c;
      }
    }
    else {
      bVar8 = false;
    }
    local_1d8._M_left = (_Base_ptr)std::_Rb_tree_increment(local_1d8._M_left);
  } while (local_1d8._M_left != &local_1d8);
LAB_0016401a:
  bVar8 = false;
LAB_0016401c:
  for (p_Var7 = (_Rb_tree_node_base *)CONCAT44(local_1a8._M_left._4_4_,(uint)local_1a8._M_left);
      p_Var7 != &local_1a8; p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    bVar8 = (bool)(bVar8 | (ushort)((short)p_Var7[1]._M_color - 800) < 0xe0);
  }
  if (bVar8) {
    this_00 = (Target *)operator_new(0xc0);
    Oric::Target::Target(this_00);
    this_00->rom = Pravetz;
    this_00->disk_interface = Pravetz;
    std::__cxx11::string::_M_replace
              ((ulong)&this_00->loading_command,0,
               (char *)(this_00->loading_command)._M_string_length,0x45f4bf);
    local_288._M_unused._0_8_ = (undefined8)this_00;
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)&local_288);
  }
  else {
    local_288._M_unused._M_object =
         anon_unknown.dwarf_28155a::AppleIITarget((Sector *)&p_Var6[1]._M_parent);
    std::
    vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
    ::
    emplace_back<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>
              ((vector<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>,std::allocator<std::unique_ptr<Analyser::Static::Target,std::default_delete<Analyser::Static::Target>>>>
                *)__return_storage_ptr__,
               (unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
                *)&local_288);
  }
  if ((Target *)local_288._M_unused._0_8_ != (Target *)0x0) {
    (**(code **)(*local_288._M_unused._M_object + 8))();
  }
  pTVar3 = (__return_storage_ptr__->
           super__Vector_base<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>,_std::allocator<std::unique_ptr<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<Analyser::Static::Target,_std::default_delete<Analyser::Static::Target>_>
           ._M_t.
           super__Tuple_impl<0UL,_Analyser::Static::Target_*,_std::default_delete<Analyser::Static::Target>_>
           .super__Head_base<0UL,_Analyser::Static::Target_*,_false>._M_head_impl;
  std::
  vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ::operator=(&(pTVar3->media).disks,&media->disks);
  std::
  vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ::operator=(&(pTVar3->media).tapes,&media->tapes);
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::operator=(&(pTVar3->media).cartridges,&media->cartridges);
  std::
  vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ::operator=(&(pTVar3->media).mass_storage_devices,&media->mass_storage_devices);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_f0);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_120);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_150);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree(&local_180);
  std::
  _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
               *)&local_1b0);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>,_std::_Select1st<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>,_std::_Select1st<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Analyser::Static::MOS6502::Instruction>_>_>
               *)local_1e0);
LAB_00164199:
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>,_std::_Select1st<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Storage::Encodings::AppleGCR::Sector>_>_>
  ::~_Rb_tree(&local_210);
  if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218);
  }
  return __return_storage_ptr__;
}

Assistant:

Analyser::Static::TargetList Analyser::Static::DiskII::GetTargets(const Media &media, const std::string &, TargetPlatform::IntType) {
	// This analyser can comprehend disks only.
	if(media.disks.empty()) return {};

	auto &disk = media.disks.front();
	TargetList targets;

	// If the disk image is too large for a 5.25" disk, map this to the IIgs.
	if(disk->get_maximum_head_position() > Storage::Disk::HeadPosition(40)) {
		targets.push_back(std::unique_ptr<Analyser::Static::Target>(AppleIIgsTarget()));
		targets.back()->media = media;
		return targets;
	}

	// Grab track 0, sector 0: the boot sector.
	const auto track_zero = disk->get_track_at_position(Storage::Disk::Track::Address(0, Storage::Disk::HeadPosition(0)));
	const auto sector_map = Storage::Encodings::AppleGCR::sectors_from_segment(
		Storage::Disk::track_serialisation(*track_zero, Storage::Time(1, 50000)));

	const Storage::Encodings::AppleGCR::Sector *sector_zero = nullptr;
	for(const auto &pair: sector_map) {
		if(!pair.second.address.sector) {
			sector_zero = &pair.second;
			break;
		}
	}

	// If there's no boot sector then if there are also no sectors at all,
	// decline to nominate a machine. Otherwise go with an Apple as the default.
	if(!sector_zero) {
		if(sector_map.empty()) {
			return targets;
		} else {
			targets.push_back(std::unique_ptr<Analyser::Static::Target>(AppleIITarget(nullptr)));
			targets.back()->media = media;
			return targets;
		}
	}

	// If the boot sector looks like it's intended for the Oric, create an Oric.
	// Otherwise go with the Apple II.

	const auto disassembly = Analyser::Static::MOS6502::Disassemble(sector_zero->data, Analyser::Static::Disassembler::OffsetMapper(0xb800), {0xb800});

	bool did_read_shift_register = false;
	bool is_oric = false;

	// Look for a tight BPL loop reading the Oric's shift register address of 0x31c. The Apple II just has RAM there,
	// so the probability of such a loop is infinitesimal.
	for(const auto &instruction: disassembly.instructions_by_address) {
		// Is this a read of the shift register?
		if(
			(
				(instruction.second.operation == Analyser::Static::MOS6502::Instruction::LDA) ||
				(instruction.second.operation == Analyser::Static::MOS6502::Instruction::LDX) ||
				(instruction.second.operation == Analyser::Static::MOS6502::Instruction::LDY)
			) &&
			instruction.second.addressing_mode == Analyser::Static::MOS6502::Instruction::Absolute &&
			instruction.second.address == 0x031c) {
			did_read_shift_register = true;
			continue;
		}

		if(did_read_shift_register) {
			if(
				instruction.second.operation == Analyser::Static::MOS6502::Instruction::BPL &&
				instruction.second.address == 0xfb) {
				is_oric = true;
				break;
			}

			did_read_shift_register = false;
		}
	}

	// Check also for calls into the 0x3xx page above 0x320, as that's where the Oric's boot ROM is.
	for(const auto address: disassembly.outward_calls) {
		is_oric |= address >= 0x320 && address < 0x400;
	}

	if(is_oric) {
		targets.push_back(std::unique_ptr<Analyser::Static::Target>(OricTarget(sector_zero)));
	} else {
		targets.push_back(std::unique_ptr<Analyser::Static::Target>(AppleIITarget(sector_zero)));
	}
	targets.back()->media = media;
	return targets;
}